

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall ctemplate::BaseArena::FreeBlocks(BaseArena *this)

{
  vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
  *this_00;
  bool bVar1;
  pointer pAVar2;
  __normal_iterator<ctemplate::BaseArena::AllocatedBlock_*,_std::vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>_>
  local_30;
  AllocatedBlock *local_28;
  __normal_iterator<ctemplate::BaseArena::AllocatedBlock_*,_std::vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>_>
  local_20;
  iterator it;
  int i;
  BaseArena *this_local;
  
  for (it._M_current._4_4_ = 1; it._M_current._4_4_ < this->blocks_alloced_;
      it._M_current._4_4_ = it._M_current._4_4_ + 1) {
    free(this->first_blocks_[it._M_current._4_4_].mem);
    this->first_blocks_[it._M_current._4_4_].mem = (char *)0x0;
    this->first_blocks_[it._M_current._4_4_].size = 0;
  }
  this->blocks_alloced_ = 1;
  if (this->overflow_blocks_ !=
      (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
       *)0x0) {
    __gnu_cxx::
    __normal_iterator<ctemplate::BaseArena::AllocatedBlock_*,_std::vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>_>
    ::__normal_iterator(&local_20);
    local_28 = (AllocatedBlock *)
               std::
               vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
               ::begin(this->overflow_blocks_);
    local_20._M_current = local_28;
    while( true ) {
      local_30._M_current =
           (AllocatedBlock *)
           std::
           vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
           ::end(this->overflow_blocks_);
      bVar1 = __gnu_cxx::operator!=(&local_20,&local_30);
      if (!bVar1) break;
      pAVar2 = __gnu_cxx::
               __normal_iterator<ctemplate::BaseArena::AllocatedBlock_*,_std::vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>_>
               ::operator->(&local_20);
      free(pAVar2->mem);
      __gnu_cxx::
      __normal_iterator<ctemplate::BaseArena::AllocatedBlock_*,_std::vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>_>
      ::operator++(&local_20);
    }
    this_00 = this->overflow_blocks_;
    if (this_00 !=
        (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
         *)0x0) {
      std::
      vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
      ::~vector(this_00);
      operator_delete(this_00);
    }
    this->overflow_blocks_ =
         (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
          *)0x0;
  }
  return;
}

Assistant:

void BaseArena::FreeBlocks() {
  for ( int i = 1; i < blocks_alloced_; ++i ) {  // keep first block alloced
    free(first_blocks_[i].mem);
    first_blocks_[i].mem = NULL;
    first_blocks_[i].size = 0;
  }
  blocks_alloced_ = 1;
  if (overflow_blocks_ != NULL) {
    vector<AllocatedBlock>::iterator it;
    for (it = overflow_blocks_->begin(); it != overflow_blocks_->end(); ++it) {
      free(it->mem);
    }
    delete overflow_blocks_;             // These should be used very rarely
    overflow_blocks_ = NULL;
  }
}